

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_rwkv_wkv6(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  void *__s;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long local_140;
  long local_130;
  int local_118;
  void *local_100;
  void *local_f8;
  long local_f0;
  void *local_d8;
  long local_d0;
  long local_c8;
  
  if (dst->src[0]->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1fb5,"fatal error");
  }
  pgVar3 = dst->src[1];
  lVar4 = dst->ne[0];
  lVar5 = pgVar3->ne[1];
  lVar12 = lVar4 / lVar5;
  lVar27 = (long)params->ith;
  if (lVar27 < lVar5) {
    iVar2 = params->nth;
    lVar13 = ((lVar27 + 1) * lVar5) / (long)iVar2;
    if (lVar5 <= lVar13) {
      lVar13 = lVar5;
    }
    if (lVar4 % lVar5 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1f12,"GGML_ASSERT(%s) failed","C % HEADS == 0");
    }
    pvVar18 = pgVar3->data;
    lVar6 = pgVar3->ne[2];
    pvVar7 = dst->src[0]->data;
    __s = dst->data;
    lVar14 = dst->src[5]->ne[1];
    pvVar8 = dst->src[3]->data;
    pvVar9 = dst->src[2]->data;
    pvVar10 = dst->src[4]->data;
    if (params->ith == 0) {
      memset(__s,0,lVar4 * lVar6 * 4);
    }
    ggml_barrier(params->threadpool);
    lVar28 = lVar12 + 0xf;
    if (-1 < lVar12) {
      lVar28 = lVar12;
    }
    if (0 < lVar6) {
      lVar28 = lVar28 >> 4;
      lVar14 = lVar6 / lVar14;
      lVar20 = (long)(int)((lVar5 * lVar27) / (long)iVar2);
      lVar1 = lVar12 * 4;
      local_118 = (int)lVar13;
      lVar15 = lVar12 * lVar12 * lVar20;
      lVar30 = lVar12 * lVar12 * 4;
      lVar27 = lVar28 * 0x40 + lVar15 * 4;
      lVar13 = lVar12 * lVar20;
      local_f8 = (void *)((long)__s + lVar13 * 4);
      local_140 = lVar28 * 0x40 + lVar13 * 4;
      local_100 = (void *)((long)pvVar18 + lVar13 * 4);
      lVar19 = 0;
      lVar13 = lVar5 * lVar12 * 4;
      local_f0 = (long)__s + local_140;
      local_140 = (long)pvVar18 + local_140;
      do {
        lVar16 = lVar19 / lVar14;
        lVar24 = lVar12 * lVar4 * lVar16;
        if (lVar19 % lVar14 == 0) {
          pvVar18 = (void *)(lVar24 * 4 + (long)dst->src[5]->data);
        }
        else {
          pvVar18 = (void *)((long)__s + lVar24 * 4 + lVar4 * lVar6 * 4);
        }
        if (lVar20 < local_118) {
          lVar16 = (lVar16 * lVar1 + lVar6 * 4) * lVar4;
          local_d0 = (long)__s + lVar16 + lVar15 * 4;
          local_c8 = (long)__s + lVar16 + lVar27;
          local_d8 = (void *)(lVar15 * 4 + (long)pvVar18);
          lVar25 = (long)pvVar18 + lVar27;
          pvVar18 = local_100;
          lVar16 = local_f0;
          pvVar29 = local_f8;
          lVar24 = local_140;
          local_130 = lVar20;
          do {
            if (0 < lVar12) {
              lVar32 = 0;
              lVar17 = local_c8;
              pvVar21 = local_d8;
              lVar22 = local_d0;
              lVar23 = lVar25;
              do {
                lVar31 = lVar32 + local_130 * lVar12 + lVar5 * lVar12 * lVar19;
                auVar33 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar7 + lVar31 * 4)));
                auVar34 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar31 * 4)));
                auVar35 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)pvVar8 +
                                                      lVar32 * 4 + local_130 * lVar12 * 4)));
                auVar36 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar10 + lVar31 * 4)));
                if (0xf < lVar12) {
                  lVar26 = 0;
                  lVar31 = lVar28;
                  do {
                    auVar37 = vmulps_avx512f(auVar33,*(undefined1 (*) [64])((long)pvVar18 + lVar26))
                    ;
                    auVar38 = vfmadd213ps_avx512f(auVar35,auVar37,
                                                  *(undefined1 (*) [64])((long)pvVar21 + lVar26));
                    auVar38 = vfmadd213ps_avx512f(auVar38,auVar34,
                                                  *(undefined1 (*) [64])((long)pvVar29 + lVar26));
                    auVar37 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pvVar21 + lVar26),
                                                  auVar36,auVar37);
                    *(undefined1 (*) [64])((long)pvVar29 + lVar26) = auVar38;
                    *(undefined1 (*) [64])(lVar22 + lVar26) = auVar37;
                    lVar26 = lVar26 + 0x40;
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                }
                if (lVar28 * 0x10 < lVar12) {
                  lVar31 = 0;
                  do {
                    auVar39 = ZEXT416((uint)(auVar33._0_4_ * *(float *)(lVar24 + lVar31 * 4)));
                    auVar40 = ZEXT416(*(uint *)(lVar23 + lVar31 * 4));
                    auVar11 = vfmadd213ss_fma(auVar35._0_16_,auVar39,auVar40);
                    auVar11 = vfmadd213ss_fma(auVar11,auVar34._0_16_,
                                              ZEXT416(*(uint *)(lVar16 + lVar31 * 4)));
                    auVar39 = vfmadd213ss_fma(auVar40,auVar36._0_16_,auVar39);
                    *(int *)(lVar16 + lVar31 * 4) = auVar11._0_4_;
                    *(int *)(lVar17 + lVar31 * 4) = auVar39._0_4_;
                    lVar31 = lVar31 + 1;
                  } while (lVar12 + lVar28 * -0x10 != lVar31);
                }
                lVar32 = lVar32 + 1;
                lVar22 = lVar22 + lVar1;
                pvVar21 = (void *)((long)pvVar21 + lVar1);
                lVar17 = lVar17 + lVar1;
                lVar23 = lVar23 + lVar1;
              } while (lVar32 != lVar12);
            }
            pvVar29 = (void *)((long)pvVar29 + lVar1);
            pvVar18 = (void *)((long)pvVar18 + lVar1);
            lVar16 = lVar16 + lVar1;
            lVar24 = lVar24 + lVar1;
            local_d0 = local_d0 + lVar30;
            local_d8 = (void *)((long)local_d8 + lVar30);
            local_c8 = local_c8 + lVar30;
            local_130 = local_130 + 1;
            lVar25 = lVar25 + lVar30;
          } while (local_130 != local_118);
        }
        local_f8 = (void *)((long)local_f8 + lVar13);
        local_100 = (void *)((long)local_100 + lVar13);
        local_f0 = local_f0 + lVar13;
        local_140 = local_140 + lVar13;
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar6);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_rwkv_wkv6(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_rwkv_wkv6_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}